

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FFontChar2::MakeTexture(FFontChar2 *this)

{
  ushort uVar1;
  ushort uVar2;
  BYTE *pBVar3;
  bool bVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  BYTE color_1;
  BYTE buff [16];
  FWadLump lump;
  byte local_a9;
  byte local_a8 [3];
  char local_a5;
  byte local_a2;
  char local_9c;
  FFontChar2 *local_98;
  uint local_8c;
  ulong local_88;
  int local_7c;
  ulong local_78;
  FWadLump local_70;
  long local_38;
  
  FWadCollection::OpenLumpNum(&local_70,&Wads,*(int *)&(this->super_FTexture).field_0x54);
  uVar1 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  local_98 = this;
  FWadLump::Read(&local_70,local_a8,4);
  if (local_a5 == '\x1a') {
    FWadLump::Read(&local_70,local_a8,0xd);
    FWadLump::Seek(&local_70,(long)local_98->SourcePos + -0x11,1);
    bVar8 = local_9c - 1;
    bVar4 = false;
  }
  else if (local_a5 == '2') {
    FWadLump::Read(&local_70,local_a8,7);
    bVar4 = true;
    FWadLump::Seek(&local_70,(long)local_98->SourcePos + -0xb,1);
    bVar8 = local_a2;
  }
  else {
    FWadLump::Seek(&local_70,(long)local_98->SourcePos + -4,1);
    bVar8 = 0xff;
    bVar4 = true;
  }
  uVar11 = (ulong)uVar2 * (ulong)uVar1;
  pbVar6 = (byte *)operator_new__(uVar11);
  local_98->Pixels = pbVar6;
  uVar7 = (ulong)(local_98->super_FTexture).Height;
  lVar12 = uVar11 - 1;
  if (bVar4) {
    local_78 = uVar7;
    if (uVar7 != 0) {
      local_38 = -(long)(int)lVar12;
      local_88 = local_88 & 0xffffffff00000000;
      local_8c = (uint)bVar8;
      iVar10 = 0;
      iVar13 = 0;
      uVar11 = uVar7;
      do {
        local_7c = (int)uVar11;
        uVar9 = (uint)(local_98->super_FTexture).Width;
        while (uVar9 != 0) {
          if (iVar13 == 0) {
            if (iVar10 == 0) {
              (*local_70.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                        (&local_70,local_a8,1);
              if ((char)local_a8[0] < '\0') {
                iVar13 = 0;
                if (local_a8[0] == 0x80) {
                  iVar10 = 0;
                }
                else {
                  (*local_70.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                            (&local_70,&local_a9,1);
                  uVar5 = (uint)local_a9;
                  if (bVar8 <= local_a9) {
                    uVar5 = local_8c;
                  }
                  pBVar3 = local_98->SourceRemap;
                  if (pBVar3 != (BYTE *)0x0) {
                    uVar5 = (uint)CONCAT71((int7)((ulong)pBVar3 >> 8),pBVar3[uVar5 & 0xff]);
                  }
                  local_88 = CONCAT44(local_88._4_4_,uVar5);
                  iVar10 = 1 - (char)local_a8[0];
                }
              }
              else {
                iVar13 = local_a8[0] + 1;
                iVar10 = 0;
              }
            }
            else {
              *pbVar6 = (byte)local_88;
              pbVar6 = pbVar6 + local_78;
              uVar9 = uVar9 - 1;
              iVar10 = iVar10 + -1;
              iVar13 = 0;
            }
          }
          else {
            (*local_70.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_70,local_a8,1);
            uVar5 = (uint)local_a8[0];
            if (bVar8 <= local_a8[0]) {
              uVar5 = local_8c;
            }
            local_a8[0] = (byte)uVar5;
            if (local_98->SourceRemap != (BYTE *)0x0) {
              local_a8[0] = local_98->SourceRemap[uVar5 & 0xff];
            }
            *pbVar6 = local_a8[0];
            pbVar6 = pbVar6 + uVar7;
            uVar9 = uVar9 - 1;
            iVar13 = iVar13 + -1;
          }
        }
        pbVar6 = pbVar6 + local_38;
        uVar11 = (ulong)(local_7c - 1U);
      } while (local_7c - 1U != 0);
    }
  }
  else if (uVar7 != 0) {
    local_88 = -lVar12;
    uVar11 = uVar7;
    do {
      local_8c = (uint)uVar11;
      uVar1 = (local_98->super_FTexture).Width;
      uVar9 = (uint)uVar1;
      if (uVar1 != 0) {
        do {
          (*local_70.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                    (&local_70,local_a8,1);
          if (bVar8 < local_a8[0]) {
            local_a8[0] = bVar8;
          }
          if (local_98->SourceRemap != (BYTE *)0x0) {
            local_a8[0] = local_98->SourceRemap[local_a8[0]];
          }
          *pbVar6 = local_a8[0];
          pbVar6 = pbVar6 + uVar7;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      pbVar6 = pbVar6 + local_88;
      uVar11 = (ulong)(local_8c - 1);
    } while (local_8c - 1 != 0);
  }
  FWadLump::~FWadLump(&local_70);
  return;
}

Assistant:

void FFontChar2::MakeTexture ()
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	int destSize = Width * Height;
	BYTE max = 255;
	bool rle = true;

	// This is to "fix" bad fonts
	{
		BYTE buff[16];
		lump.Read (buff, 4);
		if (buff[3] == '2')
		{
			lump.Read (buff, 7);
			max = buff[6];
			lump.Seek (SourcePos - 11, SEEK_CUR);
		}
		else if (buff[3] == 0x1A)
		{
			lump.Read(buff, 13);
			max = buff[12] - 1;
			lump.Seek (SourcePos - 17, SEEK_CUR);
			rle = false;
		}
		else
		{
			lump.Seek (SourcePos - 4, SEEK_CUR);
		}
	}

	Pixels = new BYTE[destSize];

	int runlen = 0, setlen = 0;
	BYTE setval = 0;  // Shut up, GCC!
	BYTE *dest_p = Pixels;
	int dest_adv = Height;
	int dest_rew = destSize - 1;

	if (rle)
	{
		for (int y = Height; y != 0; --y)
		{
			for (int x = Width; x != 0; )
			{
				if (runlen != 0)
				{
					BYTE color;

					lump >> color;
					color = MIN (color, max);
					if (SourceRemap != NULL)
					{
						color = SourceRemap[color];
					}
					*dest_p = color;
					dest_p += dest_adv;
					x--;
					runlen--;
				}
				else if (setlen != 0)
				{
					*dest_p = setval;
					dest_p += dest_adv;
					x--;
					setlen--;
				}
				else
				{
					SBYTE code;

					lump >> code;
					if (code >= 0)
					{
						runlen = code + 1;
					}
					else if (code != -128)
					{
						BYTE color;

						lump >> color;
						setlen = (-code) + 1;
						setval = MIN (color, max);
						if (SourceRemap != NULL)
						{
							setval = SourceRemap[setval];
						}
					}
				}
			}
			dest_p -= dest_rew;
		}
	}
	else
	{
		for (int y = Height; y != 0; --y)
		{
			for (int x = Width; x != 0; --x)
			{
				BYTE color;
				lump >> color;
				if (color > max)
				{
					color = max;
				}
				if (SourceRemap != NULL)
				{
					color = SourceRemap[color];
				}
				*dest_p = color;
				dest_p += dest_adv;
			}
			dest_p -= dest_rew;
		}
	}

	if (destSize < 0)
	{
		char name[9];
		Wads.GetLumpName (name, SourceLump);
		name[8] = 0;
		I_FatalError ("The font %s is corrupt", name);
	}
}